

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::Group::Add(Group *this,Base *child)

{
  pointer *pppBVar1;
  iterator __position;
  Base *local_8;
  
  __position._M_current =
       (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = child;
    std::vector<args::Base*,std::allocator<args::Base*>>::_M_realloc_insert<args::Base*>
              ((vector<args::Base*,std::allocator<args::Base*>> *)&this->children,__position,
               &local_8);
  }
  else {
    *__position._M_current = child;
    pppBVar1 = &(this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return;
}

Assistant:

void Add(Base &child)
            {
                children.emplace_back(&child);
            }